

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

Vector<const_char> __thiscall
FIX::double_conversion::Vector<const_char>::SubVector(Vector<const_char> *this,int from,int to)

{
  char *pcVar1;
  Vector<const_char> VVar2;
  int to_local;
  int from_local;
  Vector<const_char> *this_local;
  undefined4 local_10;
  
  if (this->length_ < to) {
    __assert_fail("to <= length_",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0xbb,
                  "Vector<T> FIX::double_conversion::Vector<const char>::SubVector(int, int) [T = const char]"
                 );
  }
  if (from < to) {
    if (-1 < from) {
      pcVar1 = start(this);
      Vector((Vector<const_char> *)&this_local,pcVar1 + from,to - from);
      VVar2._12_4_ = 0;
      VVar2.start_ = (char *)this_local;
      VVar2.length_ = local_10;
      return VVar2;
    }
    __assert_fail("0 <= from",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0xbd,
                  "Vector<T> FIX::double_conversion::Vector<const char>::SubVector(int, int) [T = const char]"
                 );
  }
  __assert_fail("from < to",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                ,0xbc,
                "Vector<T> FIX::double_conversion::Vector<const char>::SubVector(int, int) [T = const char]"
               );
}

Assistant:

Vector<T> SubVector(int from, int to) {
    ASSERT(to <= length_);
    ASSERT(from < to);
    ASSERT(0 <= from);
    return Vector<T>(start() + from, to - from);
  }